

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Vec2 *vectorArray,size_t length)

{
  size_t sVar1;
  GLfloat *pGVar2;
  UniformBinder binder;
  vector<float,_std::allocator<float>_> contiguous;
  UniformBinder UStack_48;
  vector<float,_std::allocator<float>_> local_38;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&local_38,length * 2,(allocator_type *)&UStack_48);
  if (length != 0) {
    sVar1 = 0;
    do {
      local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar1 * 2] = vectorArray[sVar1].x;
      local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar1 * 2 + 1] = vectorArray[sVar1].y;
      sVar1 = sVar1 + 1;
    } while (length != sVar1);
  }
  UniformBinder::UniformBinder(&UStack_48,this,name);
  if (UStack_48.location != -1) {
    pGVar2 = (GLfloat *)0x0;
    if (local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pGVar2 = local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    (*sf_glad_glUniform2fvARB)(UStack_48.location,(GLsizei)length,pGVar2);
  }
  UniformBinder::~UniformBinder(&UStack_48);
  if (local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLfloat *)0x0) {
    operator_delete(local_38.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Vec2* vectorArray, std::size_t length)
{
    std::vector<float> contiguous = flatten(vectorArray, length);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniform2fv(binder.location, static_cast<GLsizei>(length), !contiguous.empty() ? &contiguous[0] : NULL));
}